

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O2

void __thiscall
stateObservation::ZeroDelayObserver::pushMeasurement(ZeroDelayObserver *this,MeasureVector *y_k)

{
  Deque *this_00;
  uint __line;
  int iVar1;
  size_type sVar2;
  TimeIndex TVar3;
  char *__assertion;
  
  iVar1 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x18])();
  if ((char)iVar1 == '\0') {
    __assertion = "checkMeasureVector(y_k) && \"The size of the measure vector is incorrect\"";
    __line = 0x43;
  }
  else {
    this_00 = &(this->y_).v_;
    sVar2 = std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(this_00);
    if (0 < (long)sVar2) {
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(this_00,y_k);
      return;
    }
    if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.
        b_ != false) {
      TVar3 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_);
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(&this->y_,y_k,TVar3 + 1);
      return;
    }
    __assertion = 
    "x_.isSet() && \"Unable to initialize measurement without time index, the state vector has not been set.\""
    ;
    __line = 0x4b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,__line,
                "virtual void stateObservation::ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector &)"
               );
}

Assistant:

void ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector & y_k)
{

  BOOST_ASSERT(checkMeasureVector(y_k) && "The size of the measure vector is incorrect");
  if(y_.size() > 0)
  {
    y_.pushBack(y_k);
  }
  else
  {
    BOOST_ASSERT(x_.isSet()
                 && "Unable to initialize measurement without time index, the state vector has not been set.");
    /// we need the measurement of the next state to correct for the prediction
    y_.setValue(y_k, x_.getTime() + 1);
  }
}